

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# braille.hpp
# Opt level: O1

BrailleCanvas * __thiscall plot::BrailleCanvas::pop(BrailleCanvas *this,TerminalOp op)

{
  _Fwd_list_node_base *p_Var1;
  pointer pbVar2;
  pointer pbVar3;
  pointer pbVar4;
  const_iterator __j;
  
  p_Var1 = (this->stack_).
           super__Fwd_list_base<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
           ._M_impl._M_head._M_next;
  if (p_Var1 != (_Fwd_list_node_base *)0x0) {
    detail::braille::image_t::paint((image_t *)(p_Var1 + 1),&this->blocks_,op);
    p_Var1 = (this->stack_).
             super__Fwd_list_base<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
             ._M_impl._M_head._M_next;
    pbVar3 = (this->blocks_).
             super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
             .
             super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar4 = (this->blocks_).
             super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
             .
             super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar2 = (this->blocks_).
             super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
             .
             super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->blocks_).
    super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>.
    super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var1[1]._M_next;
    (this->blocks_).
    super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>.
    super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var1[2]._M_next;
    (this->blocks_).
    super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>.
    super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)p_Var1[3]._M_next;
    p_Var1[1]._M_next = (_Fwd_list_node_base *)pbVar3;
    p_Var1[2]._M_next = (_Fwd_list_node_base *)pbVar4;
    p_Var1[3]._M_next = (_Fwd_list_node_base *)pbVar2;
    if (p_Var1 != (_Fwd_list_node_base *)&this->available_layers_) {
      if (p_Var1 == (_Fwd_list_node_base *)0x0) {
        (this->stack_).
        super__Fwd_list_base<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
        ._M_impl._M_head._M_next = (_Fwd_list_node_base *)0x0;
      }
      else {
        (this->stack_).
        super__Fwd_list_base<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
        ._M_impl._M_head._M_next = p_Var1->_M_next;
        p_Var1->_M_next =
             (this->available_layers_).
             super__Fwd_list_base<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
             ._M_impl._M_head._M_next;
      }
      (this->available_layers_).
      super__Fwd_list_base<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
      ._M_impl._M_head._M_next = p_Var1;
    }
  }
  return this;
}

Assistant:

BrailleCanvas& pop(TerminalOp op = TerminalOp::Over) {
        if (!stack_.empty()) {
            stack_.front().paint(blocks_, op);
            blocks_.swap(stack_.front());
            available_layers_.splice_after(available_layers_.before_begin(), stack_, stack_.before_begin());
        }
        return *this;
    }